

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::RandomizedRenderGrid
          (RandomizedRenderGrid *this,IVec2 *targetSize,IVec2 *cellSize,int maxCellCount,
          deUint32 seed)

{
  deUint32 seed_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int local_5c;
  Vector<int,_2> local_40;
  Vector<int,_2> local_38;
  Vector<int,_2> local_30;
  deUint32 local_28;
  int local_24;
  deUint32 seed_local;
  int maxCellCount_local;
  IVec2 *cellSize_local;
  IVec2 *targetSize_local;
  RandomizedRenderGrid *this_local;
  
  local_28 = seed;
  local_24 = maxCellCount;
  _seed_local = cellSize;
  cellSize_local = targetSize;
  targetSize_local = &this->m_targetSize;
  tcu::Vector<int,_2>::Vector(&this->m_targetSize,targetSize);
  tcu::Vector<int,_2>::Vector(&this->m_cellSize,_seed_local);
  tcu::operator/((tcu *)&this->m_grid,cellSize_local,_seed_local);
  iVar3 = local_24;
  this->m_currentCell = 0;
  iVar1 = tcu::Vector<int,_2>::y(cellSize_local);
  iVar2 = tcu::Vector<int,_2>::y(_seed_local);
  if (iVar1 % iVar2 == 0) {
    iVar1 = tcu::Vector<int,_2>::y(&this->m_grid);
    if (1 < iVar1) {
      local_5c = tcu::Vector<int,_2>::x(&this->m_grid);
      iVar1 = tcu::Vector<int,_2>::y(&this->m_grid);
      local_5c = local_5c * (iVar1 + -1);
      goto LAB_009fbd64;
    }
  }
  local_5c = tcu::Vector<int,_2>::x(&this->m_grid);
  iVar1 = tcu::Vector<int,_2>::y(&this->m_grid);
  local_5c = local_5c * iVar1;
LAB_009fbd64:
  iVar3 = deMin32(iVar3,local_5c);
  seed_00 = local_28;
  this->m_cellCount = iVar3;
  tcu::Vector<int,_2>::Vector(&local_30,cellSize_local);
  tcu::Vector<int,_2>::Vector(&local_38,_seed_local);
  tcu::Vector<int,_2>::Vector(&local_40,&this->m_grid);
  getRandomOffset((RandomizedRenderGrid *)&this->m_baseRandomOffset,seed_00,&local_30,&local_38,
                  &local_40,this->m_cellCount);
  return;
}

Assistant:

RandomizedRenderGrid::RandomizedRenderGrid (const IVec2& targetSize, const IVec2& cellSize, int maxCellCount, deUint32 seed)
	: m_targetSize			(targetSize)
	, m_cellSize			(cellSize)
	, m_grid				(targetSize / cellSize)
	, m_currentCell			(0)
	// If the grid exactly fits height, take one row for randomization.
	, m_cellCount			(deMin32(maxCellCount, ((targetSize.y() % cellSize.y()) == 0) && m_grid.y() > 1 ? m_grid.x() * (m_grid.y() - 1) :  m_grid.x() * m_grid.y()))
	, m_baseRandomOffset	(getRandomOffset(seed, targetSize, cellSize, m_grid, m_cellCount))
{
}